

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

string * __thiscall
t_cpp_generator::argument_list_abi_cxx11_
          (string *__return_storage_ptr__,t_cpp_generator *this,t_struct *tstruct,bool name_params,
          bool start_comma)

{
  bool bVar1;
  reference pptVar2;
  t_type *ttype;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_60;
  t_field **local_58;
  byte local_49;
  const_iterator cStack_48;
  bool first;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  allocator local_24;
  undefined1 local_23;
  byte local_22;
  byte local_21;
  bool start_comma_local;
  t_struct *ptStack_20;
  bool name_params_local;
  t_struct *tstruct_local;
  t_cpp_generator *this_local;
  string *result;
  
  local_23 = 0;
  local_22 = start_comma;
  local_21 = name_params;
  ptStack_20 = tstruct;
  tstruct_local = (t_struct *)this;
  this_local = (t_cpp_generator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_24);
  std::allocator<char>::~allocator((allocator<char> *)&local_24);
  f_iter._M_current = (t_field **)t_struct::get_members(ptStack_20);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&stack0xffffffffffffffb8);
  local_49 = (local_22 ^ 0xff) & 1;
  local_58 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  cStack_48 = (const_iterator)local_58;
  while( true ) {
    local_60._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffffb8,&local_60);
    if (!bVar1) break;
    if ((local_49 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    }
    else {
      local_49 = 0;
    }
    pptVar2 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&stack0xffffffffffffffb8);
    ttype = t_field::get_type(*pptVar2);
    type_name_abi_cxx11_(&local_c0,this,ttype,false,true);
    std::operator+(&local_a0,&local_c0," ");
    bVar1 = (local_21 & 1) == 0;
    if (bVar1) {
      pptVar2 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&stack0xffffffffffffffb8);
      psVar3 = t_field::get_name_abi_cxx11_(*pptVar2);
      std::operator+(&local_100,"/* ",psVar3);
      std::operator+(&local_e0,&local_100," */");
    }
    else {
      pptVar2 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&stack0xffffffffffffffb8);
      psVar3 = t_field::get_name_abi_cxx11_(*pptVar2);
      std::__cxx11::string::string((string *)&local_e0,(string *)psVar3);
    }
    std::operator+(&local_80,&local_a0,&local_e0);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_e0);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_100);
    }
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&stack0xffffffffffffffb8);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::argument_list(t_struct* tstruct, bool name_params, bool start_comma) {
  string result = "";

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  bool first = !start_comma;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
    } else {
      result += ", ";
    }
    result += type_name((*f_iter)->get_type(), false, true) + " "
              + (name_params ? (*f_iter)->get_name() : "/* " + (*f_iter)->get_name() + " */");
  }
  return result;
}